

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTestsUtil.cpp
# Opt level: O1

UVec3 __thiscall
vkt::pipeline::multisample::getShaderGridSize
          (multisample *this,ImageType imageType,UVec3 *imageSize,deUint32 mipLevel)

{
  byte bVar1;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  UVec3 UVar9;
  uint uVar3;
  
  bVar1 = (byte)mipLevel;
  uVar6 = imageSize->m_data[0] >> (bVar1 & 0x1f);
  uVar6 = uVar6 + (uVar6 == 0);
  uVar4 = imageSize->m_data[1] >> (bVar1 & 0x1f);
  uVar4 = uVar4 + (uVar4 == 0);
  if (IMAGE_TYPE_BUFFER < imageType) {
    uVar6 = 1;
    uVar7 = 1;
    uVar2 = 1;
    goto LAB_0051e0df;
  }
  uVar7 = imageSize->m_data[2];
  uVar3 = 1;
  uVar2 = 1;
  uVar5 = imageSize->m_data[0];
  uVar8 = uVar7;
  switch(imageType) {
  case IMAGE_TYPE_1D:
    uVar5 = uVar6;
  case IMAGE_TYPE_BUFFER:
    uVar6 = uVar5;
    uVar7 = 1;
    goto LAB_0051e0df;
  case IMAGE_TYPE_1D_ARRAY:
    goto LAB_0051e0df;
  case IMAGE_TYPE_3D:
    uVar7 = uVar7 >> (bVar1 & 0x1f);
    uVar8 = uVar7 + (uVar7 == 0);
  case IMAGE_TYPE_2D_ARRAY:
    uVar7 = uVar4;
    uVar2 = uVar8;
    goto LAB_0051e0df;
  case IMAGE_TYPE_CUBE:
    uVar3 = 6;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar3 = uVar7 * 6;
  }
  uVar7 = uVar4;
  uVar2 = uVar3;
LAB_0051e0df:
  *(uint *)this = uVar6;
  *(uint *)(this + 4) = uVar7;
  *(uint *)(this + 8) = uVar2;
  UVar9.m_data[2] = uVar2;
  UVar9.m_data._0_8_ = this;
  return (UVec3)UVar9.m_data;
}

Assistant:

tcu::UVec3 getShaderGridSize (const ImageType imageType, const tcu::UVec3& imageSize, const deUint32 mipLevel)
{
	const deUint32 mipLevelX = std::max(imageSize.x() >> mipLevel, 1u);
	const deUint32 mipLevelY = std::max(imageSize.y() >> mipLevel, 1u);
	const deUint32 mipLevelZ = std::max(imageSize.z() >> mipLevel, 1u);

	switch (imageType)
	{
	case IMAGE_TYPE_1D:
		return tcu::UVec3(mipLevelX, 1u, 1u);

	case IMAGE_TYPE_BUFFER:
		return tcu::UVec3(imageSize.x(), 1u, 1u);

	case IMAGE_TYPE_1D_ARRAY:
		return tcu::UVec3(mipLevelX, imageSize.z(), 1u);

	case IMAGE_TYPE_2D:
		return tcu::UVec3(mipLevelX, mipLevelY, 1u);

	case IMAGE_TYPE_2D_ARRAY:
		return tcu::UVec3(mipLevelX, mipLevelY, imageSize.z());

	case IMAGE_TYPE_3D:
		return tcu::UVec3(mipLevelX, mipLevelY, mipLevelZ);

	case IMAGE_TYPE_CUBE:
		return tcu::UVec3(mipLevelX, mipLevelY, 6u);

	case IMAGE_TYPE_CUBE_ARRAY:
		return tcu::UVec3(mipLevelX, mipLevelY, 6u * imageSize.z());

	default:
		DE_FATAL("Unknown image type");
		return tcu::UVec3(1u, 1u, 1u);
	}
}